

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarSeqSweep(Abc_Ntk_t *pNtk,Fra_Ssw_t *pPars)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Aig_Man_t *pManAig;
  Aig_Man_t *p;
  Abc_Obj_t *pObj_00;
  int local_94;
  int i;
  Abc_Obj_t *pObj;
  abctime clk;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkFraig;
  Abc_Ntk_t *pNtkAig;
  Fraig_Params_t Params;
  Fra_Ssw_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  pNtkFraig = (Abc_Ntk_t *)0x0;
  Params.nInspLimit = (ABC_INT64_T)pPars;
  aVar3 = Abc_Clock();
  Fraig_ParamsSetDefault((Fraig_Params_t *)&pNtkAig);
  Params.nPatsRand = 100000;
  if ((*(int *)(Params.nInspLimit + 0x24) == 0) || (*(int *)Params.nInspLimit != 0)) {
    pMan = (Aig_Man_t *)Abc_NtkDup(pNtk);
  }
  else {
    pMan = (Aig_Man_t *)Abc_NtkFraig(pNtk,&pNtkAig,0,0);
    if (*(int *)(Params.nInspLimit + 0x34) != 0) {
      Abc_Print(1,"%s =","Initial fraiging time");
      aVar4 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
    }
  }
  pManAig = Abc_NtkToDar((Abc_Ntk_t *)pMan,0,1);
  Abc_NtkDelete((Abc_Ntk_t *)pMan);
  if (pManAig == (Aig_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    p = Fra_FraigInduction(pManAig,(Fra_Ssw_t *)Params.nInspLimit);
    Aig_ManStop(pManAig);
    if (p != (Aig_Man_t *)0x0) {
      iVar1 = Aig_ManRegNum(p);
      iVar2 = Abc_NtkLatchNum(pNtk);
      if (iVar1 < iVar2) {
        pNtkFraig = Abc_NtkFromDarSeqSweep(pNtk,p);
      }
      else {
        pNtkFraig = Abc_NtkFromDar(pNtk,p);
        for (local_94 = 0; iVar1 = Vec_PtrSize(pNtkFraig->vBoxes), local_94 < iVar1;
            local_94 = local_94 + 1) {
          pObj_00 = Abc_NtkBox(pNtkFraig,local_94);
          iVar1 = Abc_ObjIsLatch(pObj_00);
          if (iVar1 != 0) {
            Abc_LatchSetInit0(pObj_00);
          }
        }
      }
      Aig_ManStop(p);
    }
    pNtk_local = pNtkFraig;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarSeqSweep( Abc_Ntk_t * pNtk, Fra_Ssw_t * pPars )
{
    Fraig_Params_t Params;
    Abc_Ntk_t * pNtkAig = NULL, * pNtkFraig;
    Aig_Man_t * pMan, * pTemp;
    abctime clk = Abc_Clock();

    // preprocess the miter by fraiging it
    // (note that for each functional class, fraiging leaves one representative;
    // so fraiging does not reduce the number of functions represented by nodes
    Fraig_ParamsSetDefault( &Params );
    Params.nBTLimit = 100000;
    if ( pPars->fFraiging && pPars->nPartSize == 0 )
    {
        pNtkFraig = Abc_NtkFraig( pNtk, &Params, 0, 0 );
if ( pPars->fVerbose ) 
{
ABC_PRT( "Initial fraiging time", Abc_Clock() - clk );
}
    }
    else
        pNtkFraig = Abc_NtkDup( pNtk );

    pMan = Abc_NtkToDar( pNtkFraig, 0, 1 );
    Abc_NtkDelete( pNtkFraig );
    if ( pMan == NULL )
        return NULL;

//    pPars->TimeLimit = 5.0;
    pMan = Fra_FraigInduction( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );
    if ( pMan )
    {
        if ( Aig_ManRegNum(pMan) < Abc_NtkLatchNum(pNtk) )
            pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
        else
        {
            Abc_Obj_t * pObj;
            int i;
            pNtkAig = Abc_NtkFromDar( pNtk, pMan );
            Abc_NtkForEachLatch( pNtkAig, pObj, i )
                Abc_LatchSetInit0( pObj );
        }
        Aig_ManStop( pMan );
    }
    return pNtkAig;
}